

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canceled.c
# Opt level: O2

rxc_sink_logic * create_logic(rxc_sink *self)

{
  rxc_sink_logic *prVar1;
  
  prVar1 = (rxc_sink_logic *)malloc(0x38);
  if (prVar1 != (rxc_sink_logic *)0x0) {
    prVar1->sink = self;
    prVar1->dealloc = free;
    prVar1->on_connect = on_connect;
    prVar1->on_push = on_push;
    prVar1->on_upstream_finish = on_upstream_finish;
    prVar1->on_upstream_failure = on_upstream_failure;
  }
  return prVar1;
}

Assistant:

static struct rxc_sink_logic *  create_logic(struct rxc_sink *self)
{
    struct rxc_sink_logic *logic = malloc(sizeof(struct rxc_sink_logic));

    if (!logic) {
        return NULL;
    }

    logic->sink = self;
    logic->dealloc = (void (*)(struct rxc_sink_logic *)) free;
    logic->on_connect = on_connect;
    logic->on_push = on_push;
    logic->on_upstream_finish = on_upstream_finish;
    logic->on_upstream_failure = on_upstream_failure;

    return logic;
}